

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall spdlog::logger::~logger(logger *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_logger = (_func_int **)&PTR__logger_0019fde8;
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  ~vector(&(this->tracer_).messages_.v_);
  p_Var1 = (this->custom_err_handler_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->custom_err_handler_,(_Any_data *)&this->custom_err_handler_,
              __destroy_functor);
  }
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&this->sinks_);
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar3 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~logger() = default;